

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O1

SpatialForceVector * iDynTree::getRandomWrench(void)

{
  int iVar1;
  SpatialForceVector *in_RDI;
  long lVar2;
  
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[1] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[2] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[2] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[0] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[0] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[1] =
       0.0;
  in_RDI->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_0015fc98;
  lVar2 = -3;
  do {
    iVar1 = rand();
    (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data
    [lVar2] = (double)iVar1 / 2147483647.0 + 0.0;
    iVar1 = rand();
    in_RDI[1].super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data
    [lVar2 + -1] = (double)iVar1 / 2147483647.0 + 0.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return in_RDI;
}

Assistant:

SpatialForceVector getRandomWrench()
{
    SpatialForceVector ret;

    for(int i=0; i < 3; i++ )
    {
        ret.getLinearVec3()(i) = getRandomDouble();
        ret.getAngularVec3()(i) = getRandomDouble();
    }

    return ret;
}